

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::process_char_buff
          (compiler_type *this,deque<char,_std::allocator<char>_> *raw_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  char32_t cVar1;
  wint_t __wc;
  undefined1 auVar2 [16];
  var vVar3;
  var vVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  long *plVar8;
  undefined *puVar9;
  undefined8 *puVar10;
  undefined **ppuVar11;
  char32_t *pcVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar14;
  _Elt_pointer pptVar15;
  const_iterator cVar16;
  proxy *ppVar17;
  signal_types *psVar18;
  const_iterator cVar19;
  _Any_data *p_Var20;
  long lVar21;
  compile_error *pcVar22;
  pointer __p;
  size_t sVar23;
  key_type *size;
  anon_union_16_2_310e9938_for_data *size_00;
  undefined8 uVar24;
  _Alloc_hider k;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *pdVar25;
  uint uVar26;
  iterator iVar27;
  u32string sig;
  u32string tmp;
  u32string buff;
  anon_union_16_2_310e9938_for_data local_158;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_148;
  key_type local_138;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *local_118;
  undefined1 local_110 [32];
  ulong local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_d8;
  long *local_c0;
  _Base_ptr local_b8;
  any local_b0;
  compiler_type *local_a8;
  var local_a0;
  _func_int **local_98;
  undefined1 local_90 [16];
  baseHolder *local_80;
  size_t local_78;
  baseHolder local_70;
  _func_int **pp_Stack_68;
  string local_60;
  undefined **local_38;
  
  size_00 = &local_158;
  local_a8 = this;
  if ((raw_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
      _M_finish._M_cur ==
      (raw_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    pcVar22 = (compile_error *)__cxa_allocate_exception(0x28);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Received empty character buffer.","");
    compile_error::compile_error(pcVar22,&local_60);
    __cxa_throw(pcVar22,&compile_error::typeinfo,compile_error::~compile_error);
  }
  if (encoding == gbk) {
    plVar8 = (long *)operator_new(8);
    puVar9 = &codecvt::gbk::vtable;
LAB_002a7e6b:
    *plVar8 = (long)(puVar9 + 0x10);
  }
  else if (encoding == utf8) {
    plVar8 = (long *)operator_new(0x68);
    *plVar8 = 0;
    plVar8[1] = 0;
    plVar8[10] = 0;
    plVar8[0xb] = 0;
    plVar8[8] = 0;
    plVar8[9] = 0;
    plVar8[6] = 0;
    plVar8[7] = 0;
    plVar8[4] = 0;
    plVar8[5] = 0;
    plVar8[2] = 0;
    plVar8[3] = 0;
    plVar8[0xc] = 0;
    *plVar8 = (long)&PTR__utf8_00334c30;
    puVar10 = (undefined8 *)operator_new(0x20);
    *(undefined4 *)(puVar10 + 1) = 0;
    puVar10[2] = 0x10ffff;
    *(undefined4 *)(puVar10 + 3) = 0;
    *puVar10 = &PTR____codecvt_utf8_base_00334c80;
    plVar8[1] = (long)puVar10;
    plVar8[2] = (long)(plVar8 + 4);
    plVar8[3] = 0;
    *(undefined1 *)(plVar8 + 4) = 0;
    plVar8[6] = (long)(plVar8 + 8);
    plVar8[7] = 0;
    *(undefined4 *)(plVar8 + 8) = 0;
    plVar8[10] = 0;
    plVar8[0xb] = 0;
    *(undefined2 *)(plVar8 + 0xc) = 0;
    local_60._M_dataplus._M_p = (pointer)0x0;
    std::unique_ptr<cs::codecvt::utf8,_std::default_delete<cs::codecvt::utf8>_>::~unique_ptr
              ((unique_ptr<cs::codecvt::utf8,_std::default_delete<cs::codecvt::utf8>_> *)&local_60);
  }
  else {
    if (encoding == ascii) {
      plVar8 = (long *)operator_new(8);
      puVar9 = &codecvt::ascii::vtable;
      goto LAB_002a7e6b;
    }
    plVar8 = (long *)0x0;
  }
  local_c0 = plVar8;
  (**(code **)(*plVar8 + 0x10))(&local_60,plVar8,raw_buff);
  local_e8._M_allocated_capacity = (size_type)&local_d8;
  local_e8._8_8_ = 0;
  local_d8._M_local_buf[0] = L'\0';
  if (local_60._M_string_length == 0) goto switchD_002a8a5c_caseD_5;
  uVar26 = 0;
  ppuVar11 = &PTR__token_literal_00334a90;
  local_38 = &PTR__token_literal_00334a90;
  local_f0 = local_f0 & 0xffffffff00000000;
  bVar5 = false;
  local_b8 = (_Base_ptr)((ulong)local_b8 & 0xffffffff00000000);
  k._M_p = local_60._M_dataplus._M_p;
  local_118 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
  do {
    if (((ulong)local_b8 & 1) == 0) {
      if (bVar5) {
        if ((local_f0 & 1) != 0) {
          pcVar12 = mapping<char32_t,_char32_t>::match
                              ((mapping<char32_t,_char32_t> *)escape_map,(char32_t *)k._M_p);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)&local_e8,*pcVar12);
          goto LAB_002a7f55;
        }
        cVar1 = *(char32_t *)k._M_p;
        if (cVar1 == L'\\') goto LAB_002a80fb;
        if (cVar1 == L'\"') {
          sVar23 = (size_t)*(uint *)((long)k._M_p + 4);
          cVar6 = (**(code **)(*plVar8 + 0x20))(plVar8);
          if (cVar6 == '\0') {
            (**(code **)(*plVar8 + 0x18))(&local_158,plVar8,&local_e8);
            cs_impl::any::any<std::__cxx11::string>
                      ((any *)local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158);
            local_138._M_dataplus._M_p = (pointer)new_value(local_a8,(any *)local_110);
            if (*(undefined8 **)(local_118 + 0x30) ==
                (undefined8 *)(*(long *)(local_118 + 0x40) + -8)) {
              std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
              _M_push_back_aux<cs::token_base*>(local_118,(token_base **)&local_138);
            }
            else {
              **(undefined8 **)(local_118 + 0x30) = local_138._M_dataplus._M_p;
              *(long *)(local_118 + 0x30) = *(long *)(local_118 + 0x30) + 8;
            }
            cs_impl::any::recycle((any *)local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                 *)local_158._int != &local_148) {
              operator_delete((void *)local_158._int,
                              CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
            }
          }
          else {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                       *)token_base::operator_new((token_base *)0x50,sVar23);
            (**(code **)(*plVar8 + 0x18))(&local_a0,plVar8,&local_e8);
            local_80 = &local_70;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
            *(size_t *)((long)paVar14 + 8) = 1;
            paVar14->_M_allocated_capacity = (size_type)local_38;
            ((var_id *)(paVar14->_M_local_buf + 4))->m_domain_id =
                 (size_t)(paVar14->_M_local_buf + 8);
            if (local_a0.mDat == (proxy *)local_90) {
              (((shared_ptr<cs::domain_ref> *)(paVar14->_M_local_buf + 8))->
              super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   (element_type *)CONCAT71(local_90._1_7_,local_90[0]);
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(paVar14->_M_local_buf + 10))->_M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_;
            }
            else {
              ((var_id *)(paVar14->_M_local_buf + 4))->m_domain_id = (size_t)local_a0.mDat;
              (((shared_ptr<cs::domain_ref> *)(paVar14->_M_local_buf + 8))->
              super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   (element_type *)CONCAT71(local_90._1_7_,local_90[0]);
            }
            (((token_value *)(paVar14->_M_local_buf + 6))->super_token_base)._vptr_token_base =
                 local_98;
            local_98 = (_func_int **)0x0;
            local_90[0] = false;
            (((token_value *)(paVar14->_M_local_buf + 0xc))->super_token_base)._vptr_token_base =
                 (_func_int **)(paVar14->_M_local_buf + 0x10);
            if (local_80 == &local_70) {
              vVar4.mDat._1_7_ = local_70._vptr_baseHolder._1_7_;
              vVar4.mDat._0_1_ = local_70._vptr_baseHolder._0_1_;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar14->_M_local_buf + 0x10))->_M_allocated_capacity = (size_type)vVar4.mDat;
              (((token_value *)(paVar14->_M_local_buf + 0x12))->super_token_base)._vptr_token_base =
                   pp_Stack_68;
            }
            else {
              (((token_value *)(paVar14->_M_local_buf + 0xc))->super_token_base)._vptr_token_base =
                   (_func_int **)local_80;
              vVar3.mDat._1_7_ = local_70._vptr_baseHolder._1_7_;
              vVar3.mDat._0_1_ = local_70._vptr_baseHolder._0_1_;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar14->_M_local_buf + 0x10))->_M_allocated_capacity = (size_type)vVar3.mDat;
            }
            *(size_t *)(paVar14->_M_local_buf + 0xe) = local_78;
            local_78 = 0;
            local_70._vptr_baseHolder._0_1_ = 0;
            local_158._int = (numeric_integer)paVar14;
            local_a0.mDat = (proxy *)local_90;
            local_80 = &local_70;
            if (*(undefined8 **)(local_118 + 0x30) ==
                (undefined8 *)(*(long *)(local_118 + 0x40) + -8)) {
              std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
              _M_push_back_aux<cs::token_base*>(local_118,(token_base **)&local_158._int);
            }
            else {
              **(undefined8 **)(local_118 + 0x30) = paVar14;
              *(long *)(local_118 + 0x30) = *(long *)(local_118 + 0x30) + 8;
            }
            if (local_80 != &local_70) {
              operator_delete(local_80,CONCAT71(local_70._vptr_baseHolder._1_7_,
                                                local_70._vptr_baseHolder._0_1_) + 1);
            }
            if (local_a0.mDat != (proxy *)local_90) {
              operator_delete(local_a0.mDat,CONCAT71(local_90._1_7_,local_90[0]) + 1);
            }
            uVar26 = 8;
          }
          local_e8._8_8_ = 0;
          *(char32_t *)local_e8._M_allocated_capacity = L'\0';
          bVar5 = false;
        }
        else {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)&local_e8,cVar1);
        }
        goto LAB_002a87ea;
      }
      __wc = *(wint_t *)k._M_p;
      if (__wc == 0x23) break;
      if (uVar26 < 9) {
        uVar13 = (ulong)uVar26;
        switch(uVar26) {
        case 0:
          if (__wc == 0x27) {
            k._M_p = k._M_p + 4;
            uVar26 = 0;
            local_b8 = (_Base_ptr)
                       CONCAT44(local_b8._4_4_,
                                (int)CONCAT71((int7)((ulong)((long)&switchD_002a8012::
                                                                    switchdataD_002dbf90 +
                                                            (long)(int)(&switchD_002a8012::
                                                                         switchdataD_002dbf90)
                                                                       [uVar13]) >> 8),1));
          }
          else if (__wc == 0x22) {
            k._M_p = k._M_p + 4;
            uVar26 = 0;
            bVar5 = true;
          }
          else {
            iVar7 = iswspace(__wc);
            if (iVar7 != 0) {
              k._M_p = k._M_p + 4;
              goto LAB_002a88b8;
            }
            auVar2 = ZEXT416(*(uint *)k._M_p) * ZEXT816(0xde5fb9d2630458e9);
            local_158._int._0_4_ = *(uint *)k._M_p;
            iVar27 = phmap::priv::
                     raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                     ::find<char32_t>((raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                                       *)&signals,(key_arg<char32_t> *)&local_158._int,
                                      auVar2._8_8_ + auVar2._0_8_);
            uVar26 = 3;
            if (iVar27.ctrl_ == (ctrl_t *)(signals + DAT_00345398)) {
              iVar7 = iswdigit(*(wint_t *)k._M_p);
              uVar26 = 7;
              if (iVar7 == 0) {
                cVar6 = (**(code **)(*plVar8 + 0x20))(plVar8,*(undefined4 *)k._M_p);
                uVar26 = 4;
                if (cVar6 == '\0') {
                  pcVar22 = (compile_error *)__cxa_allocate_exception(0x28);
                  local_110._16_4_ = *(undefined4 *)k._M_p;
                  local_110._0_8_ = local_110 + 0x10;
                  local_110._8_8_ = 1;
                  local_110._20_4_ = L'\0';
                  (**(code **)(*plVar8 + 0x18))(&local_138,plVar8);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_158,"Uknown character: ",&local_138);
                  compile_error::compile_error(pcVar22,(string *)&local_158);
                  __cxa_throw(pcVar22,&compile_error::typeinfo,compile_error::~compile_error);
                }
              }
            }
          }
          break;
        case 8:
          cVar6 = (**(code **)(*plVar8 + 0x20))(plVar8);
          if (cVar6 == '\0') {
            (**(code **)(*plVar8 + 0x18))(&local_158,plVar8,&local_e8);
            pptVar15 = *(_Elt_pointer *)(local_118 + 0x30);
            if (pptVar15 == *(_Elt_pointer *)(local_118 + 0x38)) {
              pptVar15 = (*(_Map_pointer *)(local_118 + 0x48))[-1] + 0x40;
            }
            std::__cxx11::string::operator=((string *)(pptVar15[-1] + 3),(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                 *)local_158._int != &local_148) {
              operator_delete((void *)local_158._int,
                              CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
            }
            local_e8._8_8_ = 0;
            *(char32_t *)local_e8._M_allocated_capacity = L'\0';
LAB_002a88b8:
            uVar26 = 0;
          }
          else {
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)&local_e8,*(char32_t *)k._M_p);
            k._M_p = k._M_p + 4;
            uVar26 = 8;
          }
        }
      }
    }
    else {
      if ((local_f0 & 1) == 0) {
        cVar1 = *(char32_t *)k._M_p;
        if (cVar1 == L'\\') {
LAB_002a80fb:
          local_f0 = CONCAT44(local_f0._4_4_,(int)CONCAT71((int7)((ulong)ppuVar11 >> 8),1));
        }
        else if (cVar1 == L'\'') {
          if (local_e8._8_8_ != 1) {
            if (local_e8._8_8_ == 0) {
              pcVar22 = (compile_error *)__cxa_allocate_exception(0x28);
              local_158._int = (numeric_integer)&local_148;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,"Do not allow empty character.","");
              compile_error::compile_error(pcVar22,(string *)&local_158);
              __cxa_throw(pcVar22,&compile_error::typeinfo,compile_error::~compile_error);
            }
            pcVar22 = (compile_error *)__cxa_allocate_exception(0x28);
            local_158._int = (numeric_integer)&local_148;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,"Char must be a single character.","");
            compile_error::compile_error(pcVar22,(string *)&local_158);
            __cxa_throw(pcVar22,&compile_error::typeinfo,compile_error::~compile_error);
          }
          if (0x7f < (uint)*(char32_t *)local_e8._M_allocated_capacity) {
            pcVar22 = (compile_error *)__cxa_allocate_exception(0x28);
            local_158._int = (numeric_integer)&local_148;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,
                       "Do not support unicode character. Please using string instead.","");
            compile_error::compile_error(pcVar22,(string *)&local_158);
            __cxa_throw(pcVar22,&compile_error::typeinfo,compile_error::~compile_error);
          }
          local_110[0] = (char)*(char32_t *)local_e8._M_allocated_capacity;
          cs_impl::any::any<char>((any *)&local_138,local_110);
          local_158._int = (numeric_integer)new_value(local_a8,(var *)&local_138);
          if (*(undefined8 **)(local_118 + 0x30) == (undefined8 *)(*(long *)(local_118 + 0x40) + -8)
             ) {
            std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
            _M_push_back_aux<cs::token_base*>(local_118,(token_base **)&local_158._int);
          }
          else {
            **(undefined8 **)(local_118 + 0x30) = local_158._int;
            *(long *)(local_118 + 0x30) = *(long *)(local_118 + 0x30) + 8;
          }
          cs_impl::any::recycle((any *)&local_138);
          local_e8._8_8_ = 0;
          *(char32_t *)local_e8._M_allocated_capacity = L'\0';
          local_b8 = (_Base_ptr)((ulong)local_b8 & 0xffffffff00000000);
        }
        else {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)&local_e8,cVar1);
        }
      }
      else {
        pcVar12 = mapping<char32_t,_char32_t>::match
                            ((mapping<char32_t,_char32_t> *)escape_map,(char32_t *)k._M_p);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *
                    )&local_e8,*pcVar12);
LAB_002a7f55:
        local_f0 = local_f0 & 0xffffffff00000000;
      }
LAB_002a87ea:
      k._M_p = k._M_p + 4;
    }
    ppuVar11 = (undefined **)(local_60._M_dataplus._M_p + local_60._M_string_length * 4);
  } while ((undefined **)k._M_p != ppuVar11);
  uVar24 = local_e8._M_allocated_capacity;
  pdVar25 = local_118;
  if (((ulong)local_b8 & 1) != 0) {
    pcVar22 = (compile_error *)__cxa_allocate_exception(0x28);
    local_158._int = (numeric_integer)&local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Lack of the \'.","");
    compile_error::compile_error(pcVar22,(string *)&local_158);
    __cxa_throw(pcVar22,&compile_error::typeinfo,compile_error::~compile_error);
  }
  if (bVar5) {
    pcVar22 = (compile_error *)__cxa_allocate_exception(0x28);
    local_158._int = (numeric_integer)&local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Lack of the \".","");
    compile_error::compile_error(pcVar22,(string *)&local_158);
    __cxa_throw(pcVar22,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_f0 = local_e8._8_8_;
  if (local_e8._8_8_ == 0) goto switchD_002a8a5c_caseD_5;
  switch(uVar26) {
  case 3:
    local_158._int = (numeric_integer)&local_148;
    local_158._8_8_ = 0;
    local_148._M_local_buf[0] = L'\0';
    local_f0 = local_e8._8_8_ << 2;
    lVar21 = 0;
    local_b8 = (_Base_ptr)(signal_map_abi_cxx11_ + 8);
    do {
      cVar1 = *(char32_t *)(lVar21 + uVar24);
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)local_110,local_158._int,local_158._int + local_158._8_8_ * 4);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_replace_aux((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)local_110,local_110._8_8_,0,1,cVar1);
      (**(code **)(*local_c0 + 0x18))
                (&local_138,local_c0,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_110);
      size = &local_138;
      cVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>_>
                       *)signal_map_abi_cxx11_,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        size = (key_type *)(local_138.field_2._M_allocated_capacity + 1);
        operator_delete(local_138._M_dataplus._M_p,(ulong)size);
      }
      if ((proxy *)local_110._0_8_ != (proxy *)(local_110 + 0x10)) {
        size = (key_type *)(CONCAT44(local_110._20_4_,local_110._16_4_) * 4 + 4);
        operator_delete((void *)local_110._0_8_,(ulong)size);
      }
      if (cVar16._M_node == local_b8) {
        ppVar17 = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)size);
        (**(code **)(*local_c0 + 0x18))(&local_138,local_c0,&local_158);
        psVar18 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                  ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                           *)signal_map_abi_cxx11_,&local_138);
        token_signal::token_signal((token_signal *)ppVar17,*psVar18);
        local_110._0_8_ = ppVar17;
        if (*(undefined8 **)(local_118 + 0x30) == (undefined8 *)(*(long *)(local_118 + 0x40) + -8))
        {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*>(local_118,(token_base **)local_110);
        }
        else {
          **(undefined8 **)(local_118 + 0x30) = ppVar17;
          *(long *)(local_118 + 0x30) = *(long *)(local_118 + 0x30) + 8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        sVar23 = 0;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::_M_replace_aux((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)&local_158,0,local_158._8_8_,1,*(char32_t *)(lVar21 + uVar24));
        pdVar25 = local_118;
      }
      else {
        sVar23 = (size_t)(uint)*(char32_t *)(lVar21 + uVar24);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *
                    )&local_158,*(char32_t *)(lVar21 + uVar24));
      }
      plVar8 = local_c0;
      lVar21 = lVar21 + 4;
    } while (local_f0 != lVar21);
    if (local_158._8_8_ != 0) {
      ppVar17 = (proxy *)token_base::operator_new((token_base *)0x18,sVar23);
      (**(code **)(*plVar8 + 0x18))(&local_138,plVar8,&local_158);
      psVar18 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                         *)signal_map_abi_cxx11_,&local_138);
      token_signal::token_signal((token_signal *)ppVar17,*psVar18);
      local_110._0_8_ = ppVar17;
      if (*(undefined8 **)(pdVar25 + 0x30) == (undefined8 *)(*(long *)(pdVar25 + 0x40) + -8)) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*>(pdVar25,(token_base **)local_110);
      }
      else {
        **(undefined8 **)(pdVar25 + 0x30) = ppVar17;
        *(long *)(pdVar25 + 0x30) = *(long *)(pdVar25 + 0x30) + 8;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_158._int == &local_148) goto switchD_002a8a5c_caseD_5;
    uVar13 = CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) * 4 + 4;
    uVar24 = local_158._int;
    goto LAB_002a8f14;
  case 4:
    (**(code **)(*plVar8 + 0x18))(&local_158,plVar8,&local_e8);
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>_>
                     *)reserved_map_abi_cxx11_,(key_type *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_158._int != &local_148) {
      size_00 = (anon_union_16_2_310e9938_for_data *)
                (CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
      operator_delete((void *)local_158._int,(ulong)size_00);
    }
    if (cVar19._M_node != (_Base_ptr)(reserved_map_abi_cxx11_ + 8)) {
      (**(code **)(*plVar8 + 0x18))(&local_158,plVar8,&local_e8);
      p_Var20 = (_Any_data *)
                mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                         *)reserved_map_abi_cxx11_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_158);
      if (*(long *)(p_Var20 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      local_138._M_dataplus._M_p = (pointer)(**(code **)(p_Var20->_M_pod_data + 0x18))(p_Var20);
      if (*(undefined8 **)(pdVar25 + 0x30) == (undefined8 *)(*(long *)(pdVar25 + 0x40) + -8)) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*>(pdVar25,(token_base **)&local_138);
      }
      else {
        **(undefined8 **)(pdVar25 + 0x30) = local_138._M_dataplus._M_p;
        *(long *)(pdVar25 + 0x30) = *(long *)(pdVar25 + 0x30) + 8;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_158._int != &local_148) {
        operator_delete((void *)local_158._int,
                        CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
      }
      local_e8._8_8_ = 0;
      *(char32_t *)local_e8._M_allocated_capacity = L'\0';
      goto switchD_002a8a5c_caseD_5;
    }
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
               *)token_base::operator_new((token_base *)0x50,(size_t)size_00);
    (**(code **)(*plVar8 + 0x18))(&local_158,plVar8,&local_e8);
    token_id::token_id((token_id *)paVar14,(string *)&local_158);
    local_138._M_dataplus._M_p = (pointer)paVar14;
    if (*(undefined8 **)(pdVar25 + 0x30) == (undefined8 *)(*(long *)(pdVar25 + 0x40) + -8)) {
      std::deque<cs::token_base*,std::allocator<cs::token_base*>>::_M_push_back_aux<cs::token_base*>
                (pdVar25,(token_base **)&local_138);
    }
    else {
      **(undefined8 **)(pdVar25 + 0x30) = paVar14;
      *(long *)(pdVar25 + 0x30) = *(long *)(pdVar25 + 0x30) + 8;
    }
    break;
  default:
    goto switchD_002a8a5c_caseD_5;
  case 7:
    (**(code **)(*plVar8 + 0x18))(&local_138,plVar8,&local_e8);
    parse_number((numeric *)&local_158,&local_138);
    cs_impl::any::any<cs::numeric>(&local_b0,(numeric *)&local_158);
    local_110._0_8_ = new_value(local_a8,&local_b0);
    if (*(undefined8 **)(pdVar25 + 0x30) == (undefined8 *)(*(long *)(pdVar25 + 0x40) + -8)) {
      std::deque<cs::token_base*,std::allocator<cs::token_base*>>::_M_push_back_aux<cs::token_base*>
                (pdVar25,(token_base **)local_110);
    }
    else {
      **(undefined8 **)(pdVar25 + 0x30) = local_110._0_8_;
      *(long *)(pdVar25 + 0x30) = *(long *)(pdVar25 + 0x30) + 8;
    }
    cs_impl::any::recycle(&local_b0);
    uVar24 = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto switchD_002a8a5c_caseD_5;
    goto LAB_002a8f11;
  case 8:
    (**(code **)(*plVar8 + 0x18))(&local_158,plVar8,&local_e8);
    lVar21 = *(long *)(pdVar25 + 0x30);
    if (lVar21 == *(long *)(pdVar25 + 0x38)) {
      lVar21 = *(long *)(*(long *)(pdVar25 + 0x48) + -8) + 0x200;
    }
    std::__cxx11::string::operator=((string *)(*(long *)(lVar21 + -8) + 0x30),(string *)&local_158);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_158._int != &local_148) {
    local_138.field_2._M_allocated_capacity =
         CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]);
    uVar24 = local_158._int;
LAB_002a8f11:
    uVar13 = local_138.field_2._M_allocated_capacity + 1;
LAB_002a8f14:
    operator_delete((void *)uVar24,uVar13);
  }
switchD_002a8a5c_caseD_5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_e8._M_allocated_capacity != &local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity,
                    CONCAT44(local_d8._M_local_buf[1],local_d8._M_local_buf[0]) * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 4 + 4);
  }
  if (plVar8 != (long *)0x0) {
    (**(code **)(*plVar8 + 8))(plVar8);
  }
  return;
}

Assistant:

void compiler_type::process_char_buff(const std::deque<char> &raw_buff, std::deque<token_base *> &tokens,
	                                      charset encoding)
	{
		if (raw_buff.empty())
			throw compile_error("Received empty character buffer.");
		std::unique_ptr<codecvt::charset> cvt = nullptr;
		switch (encoding) {
		case charset::ascii:
			cvt = std::make_unique<codecvt::ascii>();
			break;
		case charset::utf8:
			cvt = std::make_unique<codecvt::utf8>();
			break;
		case charset::gbk:
			cvt = std::make_unique<codecvt::gbk>();
			break;
		}
		std::u32string buff = cvt->local2wide(raw_buff);
		std::u32string tmp;
		token_types type = token_types::null;
		bool inside_char = false;
		bool inside_str = false;
		bool escape = false;
		for (auto it = buff.begin(); it != buff.end();) {
			if (inside_char) {
				if (escape) {
					tmp += escape_map.match(*it);
					escape = false;
				}
				else if (*it == '\\') {
					escape = true;
				}
				else if (*it == '\'') {
					if (tmp.empty())
						throw compile_error("Do not allow empty character.");
					if (tmp.size() > 1)
						throw compile_error("Char must be a single character.");
					if (tmp[0] > CHAR_MAX)
						throw compile_error("Do not support unicode character. Please using string instead.");
					tokens.push_back(new_value((char) tmp[0]));
					tmp.clear();
					inside_char = false;
				}
				else {
					tmp += *it;
				}
				++it;
				continue;
			}
			if (inside_str) {
				if (escape) {
					tmp += escape_map.match(*it);
					escape = false;
				}
				else if (*it == '\\') {
					escape = true;
				}
				else if (*it == '\"') {
					inside_str = false;
					if (cvt->is_identifier(*(it + 1))) {
						tokens.push_back(new token_literal(cvt->wide2local(tmp), ""));
						type = token_types::literal;
					}
					else
						tokens.push_back(new_value(cvt->wide2local(tmp)));
					tmp.clear();
				}
				else {
					tmp += *it;
				}
				++it;
				continue;
			}
			if (*it == '#')
				break;
			switch (type) {
			default:
				break;
			case token_types::null:
				if (*it == '\"') {
					inside_str = true;
					++it;
					continue;
				}
				if (*it == '\'') {
					inside_char = true;
					++it;
					continue;
				}
				if (std::iswspace(*it)) {
					++it;
					continue;
				}
				if (issignal(*it)) {
					type = token_types::signal;
					continue;
				}
				if (std::iswdigit(*it)) {
					type = token_types::value;
					continue;
				}
				if (cvt->is_identifier(*it)) {
					type = token_types::id;
					continue;
				}
				throw compile_error(std::string("Uknown character: " + cvt->wide2local(std::u32string(1, *it))));
				break;
			case token_types::id:
				if (cvt->is_identifier(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				if (reserved_map.exist(cvt->wide2local(tmp))) {
					tokens.push_back(reserved_map.match(cvt->wide2local(tmp))());
					tmp.clear();
					break;
				}
				tokens.push_back(new token_id(cvt->wide2local(tmp)));
				tmp.clear();
				break;
			case token_types::literal:
				if (cvt->is_identifier(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				static_cast<token_literal *>(tokens.back())->m_literal = cvt->wide2local(tmp);
				tmp.clear();
				break;
			case token_types::signal: {
				if (issignal(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				std::u32string sig;
				for (auto &ch: tmp) {
					if (!signal_map.exist(cvt->wide2local(sig + ch))) {
						tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
						sig = ch;
					}
					else
						sig += ch;
				}
				if (!sig.empty())
					tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
				tmp.clear();
				break;
			}
			case token_types::value:
				if (std::iswdigit(*it) || *it == '.') {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				tokens.push_back(new_value(parse_number(cvt->wide2local(tmp))));
				tmp.clear();
				break;
			}
		}
		if (inside_char)
			throw compile_error("Lack of the \'.");
		if (inside_str)
			throw compile_error("Lack of the \".");
		if (tmp.empty())
			return;
		switch (type) {
		default:
			break;
		case token_types::id:
			if (reserved_map.exist(cvt->wide2local(tmp))) {
				tokens.push_back(reserved_map.match(cvt->wide2local(tmp))());
				tmp.clear();
				break;
			}
			tokens.push_back(new token_id(cvt->wide2local(tmp)));
			break;
		case token_types::literal:
			static_cast<token_literal *>(tokens.back())->m_literal = cvt->wide2local(tmp);
			break;
		case token_types::signal: {
			std::u32string sig;
			for (auto &ch: tmp) {
				if (!signal_map.exist(cvt->wide2local(sig + ch))) {
					tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
					sig = ch;
				}
				else
					sig += ch;
			}
			if (!sig.empty())
				tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
			break;
		}
		case token_types::value:
			tokens.push_back(new_value(parse_number(cvt->wide2local(tmp))));
			break;
		}
	}